

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_gen_edge_face(REF_CELL ref_cell,REF_INT edge,REF_INT *face0,REF_INT *face1)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  REF_INT *pRVar7;
  bool bVar8;
  bool bVar9;
  
  *face0 = -1;
  *face1 = -1;
  if (0 < ref_cell->face_per) {
    iVar1 = ref_cell->e2n[edge * 2];
    iVar2 = ref_cell->e2n[edge * 2 + 1];
    piVar4 = ref_cell->f2n + 3;
    lVar6 = 0;
    do {
      bVar9 = true;
      bVar8 = true;
      if (((iVar1 != piVar4[-3]) && (iVar1 != piVar4[-2])) && (iVar1 != piVar4[-1])) {
        bVar8 = iVar1 == *piVar4;
      }
      if (((iVar2 != piVar4[-3]) && (iVar2 != piVar4[-2])) && (iVar2 != piVar4[-1])) {
        bVar9 = iVar2 == *piVar4;
      }
      if ((bool)(bVar8 & bVar9)) {
        pRVar7 = face0;
        if ((*face0 != -1) && (pRVar7 = face1, *face1 != -1)) {
          pcVar5 = "face1 set twice";
          uVar3 = 0x554;
          goto LAB_0011f966;
        }
        *pRVar7 = (REF_INT)lVar6;
      }
      lVar6 = lVar6 + 1;
      piVar4 = piVar4 + 4;
    } while (lVar6 < ref_cell->face_per);
  }
  if (*face0 == -1) {
    pcVar5 = "face0 not set";
    uVar3 = 0x55a;
  }
  else {
    if (*face1 != -1) {
      return 0;
    }
    pcVar5 = "face1 not set";
    uVar3 = 0x55b;
  }
LAB_0011f966:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar3,
         "ref_cell_gen_edge_face",pcVar5);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_gen_edge_face(REF_CELL ref_cell, REF_INT edge,
                                          REF_INT *face0, REF_INT *face1) {
  REF_INT face, node0, node1;
  REF_BOOL have_node0;
  REF_BOOL have_node1;

  *face0 = REF_EMPTY;
  *face1 = REF_EMPTY;

  node0 = ref_cell_e2n_gen(ref_cell, 0, edge);
  node1 = ref_cell_e2n_gen(ref_cell, 1, edge);

  for (face = 0; face < ref_cell_face_per(ref_cell); face++) {
    have_node0 = (node0 == ref_cell_f2n_gen(ref_cell, 0, face) ||
                  node0 == ref_cell_f2n_gen(ref_cell, 1, face) ||
                  node0 == ref_cell_f2n_gen(ref_cell, 2, face) ||
                  node0 == ref_cell_f2n_gen(ref_cell, 3, face));
    have_node1 = (node1 == ref_cell_f2n_gen(ref_cell, 0, face) ||
                  node1 == ref_cell_f2n_gen(ref_cell, 1, face) ||
                  node1 == ref_cell_f2n_gen(ref_cell, 2, face) ||
                  node1 == ref_cell_f2n_gen(ref_cell, 3, face));
    if (have_node0 && have_node1) {
      if ((*face0) == REF_EMPTY) {
        (*face0) = face;
      } else {
        RAS(REF_EMPTY == (*face1), "face1 set twice");
        (*face1) = face;
      }
    }
  }

  RAS(REF_EMPTY != (*face0), "face0 not set");
  RAS(REF_EMPTY != (*face1), "face1 not set");

  return REF_SUCCESS;
}